

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_persistence_matrix_field_operators.cpp
# Opt level: O2

void test_z2_standart_field_operators<Gudhi::persistence_fields::Zp_field_operators<unsigned_int,void>>
               (Zp_field_operators<unsigned_int,_void> *op)

{
  Zp_field_operators<unsigned_int,_void> *pZVar1;
  ulong uVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  Element_conflict EVar8;
  Element_conflict e1;
  Element_conflict EVar9;
  undefined **local_698;
  undefined1 local_690;
  undefined8 *local_688;
  char *local_680;
  uint z21;
  undefined8 local_670;
  char *local_668;
  uint local_660 [2];
  undefined8 local_658;
  shared_count sStack_650;
  Zp_field_operators<unsigned_int,_void> *local_648;
  ulong local_640;
  ulong local_638;
  char *local_630;
  char *local_628;
  char *local_620;
  char *local_618;
  char *local_610;
  char *local_608;
  char *local_600;
  char *local_5f8;
  char *local_5f0;
  char *local_5e8;
  char *local_5e0;
  char *local_5d8;
  char *local_5d0;
  char *local_5c8;
  char *local_5c0;
  char *local_5b8;
  char *local_5b0;
  char *local_5a8;
  char *local_5a0;
  char *local_598;
  char *local_590;
  char *local_588;
  char *local_580;
  char *local_578;
  char *local_570;
  char *local_568;
  char *local_560;
  char *local_558;
  char *local_550;
  char *local_548;
  char *local_540;
  char *local_538;
  char *local_530;
  char *local_528;
  char *local_520;
  char *local_518;
  char *local_510;
  char *local_508;
  char *local_500;
  char *local_4f8;
  char *local_4f0;
  char *local_4e8;
  char *local_4e0;
  char *local_4d8;
  char *local_4d0;
  char *local_4c8;
  undefined1 *local_4c0;
  undefined1 *local_4b8;
  char *local_4b0;
  char *local_4a8;
  char *local_4a0;
  char *local_498;
  undefined1 *local_490;
  undefined1 *local_488;
  char *local_480;
  char *local_478;
  char *local_470;
  char *local_468;
  undefined1 *local_460;
  undefined1 *local_458;
  char *local_450;
  char *local_448;
  char *local_440;
  char *local_438;
  undefined1 *local_430;
  undefined1 *local_428;
  char *local_420;
  char *local_418;
  char *local_410;
  char *local_408;
  undefined1 *local_400;
  undefined1 *local_3f8;
  char *local_3f0;
  char *local_3e8;
  char *local_3e0;
  char *local_3d8;
  undefined1 *local_3d0;
  undefined1 *local_3c8;
  char *local_3c0;
  char *local_3b8;
  undefined1 *local_3b0;
  undefined1 *local_3a8;
  char *local_3a0;
  char *local_398;
  undefined1 *local_390;
  undefined1 *local_388;
  char *local_380;
  char *local_378;
  undefined1 *local_370;
  undefined1 *local_368;
  char *local_360;
  char *local_358;
  undefined1 *local_350;
  undefined1 *local_348;
  char *local_340;
  char *local_338;
  undefined1 *local_330;
  undefined1 *local_328;
  char *local_320;
  char *local_318;
  undefined1 *local_310;
  undefined1 *local_308;
  char *local_300;
  char *local_2f8;
  char *local_2f0;
  char *local_2e8;
  undefined1 *local_2e0;
  undefined1 *local_2d8;
  char *local_2d0;
  char *local_2c8;
  char *local_2c0;
  char *local_2b8;
  undefined1 *local_2b0;
  undefined1 *local_2a8;
  char *local_2a0;
  char *local_298;
  undefined1 *local_290;
  undefined1 *local_288;
  char *local_280;
  char *local_278;
  undefined1 *local_270;
  undefined1 *local_268;
  char *local_260;
  char *local_258;
  undefined1 *local_250;
  undefined1 *local_248;
  char *local_240;
  char *local_238;
  undefined1 *local_230;
  undefined1 *local_228;
  char *local_220;
  char *local_218;
  undefined1 *local_210;
  undefined1 *local_208;
  char *local_200;
  char *local_1f8;
  undefined1 *local_1f0;
  undefined1 *local_1e8;
  char *local_1e0;
  char *local_1d8;
  char *local_1d0;
  char *local_1c8;
  undefined1 *local_1c0;
  undefined1 *local_1b8;
  char *local_1b0;
  char *local_1a8;
  char *local_1a0;
  char *local_198;
  undefined1 *local_190;
  undefined1 *local_188;
  char *local_180;
  char *local_178;
  undefined1 *local_170;
  undefined1 *local_168;
  char *local_160;
  char *local_158;
  undefined1 *local_150;
  undefined1 *local_148;
  char *local_140;
  char *local_138;
  undefined1 *local_130;
  undefined1 *local_128;
  char *local_120;
  char *local_118;
  undefined1 *local_110;
  undefined1 *local_108;
  char *local_100;
  char *local_f8;
  undefined1 *local_f0;
  undefined1 *local_e8;
  char *local_e0;
  char *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  char *local_c0;
  char *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  char *local_a0;
  char *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  char *local_80;
  char *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  z21 = 7;
  uVar4 = op->characteristic_;
  local_640 = 2;
  bVar3 = 7;
  if (uVar4 < 8) {
    bVar3 = 7 % (byte)uVar4;
    if (uVar4 < 3) {
      local_640 = (ulong)(byte)(2 % (byte)uVar4);
    }
  }
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x25);
  local_690 = 0;
  local_698 = &PTR__lazy_ostream_00118ce8;
  local_688 = &boost::unit_test::lazy_ostream::inst;
  local_680 = "";
  local_4e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_4d8 = "";
  local_660[0] = z21 * 2 + 3;
  if (op->characteristic_ <= local_660[0]) {
    local_660[0] = local_660[0] % op->characteristic_;
  }
  local_670._0_4_ = 1;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
            (&local_698,&local_4e0,0x25,1,2,local_660,"op.multiply_and_add(z21, z22, 3u)",&local_670
             ,"1");
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_58 = "";
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_60,0x26);
  local_690 = 0;
  local_698 = &PTR__lazy_ostream_00118ce8;
  local_688 = &boost::unit_test::lazy_ostream::inst;
  local_680 = "";
  local_4f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_4e8 = "";
  local_660[0] = (int)local_640 * (uint)bVar3 + 3;
  if (op->characteristic_ <= local_660[0]) {
    local_660[0] = (uint)(byte)(((ushort)local_660[0] & 0xff) % (ushort)(byte)op->characteristic_);
  }
  local_670._0_4_ = 1;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
            (&local_698,&local_4f0,0x26,1,2,local_660,"op.multiply_and_add(z23, z24, T(3))",
             &local_670,"1");
  local_80 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_78 = "";
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  local_88 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_80,0x29);
  local_690 = 0;
  local_698 = &PTR__lazy_ostream_00118ce8;
  local_688 = &boost::unit_test::lazy_ostream::inst;
  local_680 = "";
  local_500 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_4f8 = "";
  local_660[0] = z21 * 3 + 6;
  if (op->characteristic_ <= local_660[0]) {
    local_660[0] = local_660[0] % op->characteristic_;
  }
  local_670._0_4_ = 1;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
            (&local_698,&local_500,0x29,1,2,local_660,"op.add_and_multiply(z21, z22, 3u)",&local_670
             ,"1");
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_98 = "";
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a0,0x2a);
  local_690 = 0;
  local_698 = &PTR__lazy_ostream_00118ce8;
  local_688 = &boost::unit_test::lazy_ostream::inst;
  local_680 = "";
  local_510 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_508 = "";
  local_660[0] = ((int)local_640 + (uint)bVar3) * 3;
  if (op->characteristic_ <= local_660[0]) {
    local_660[0] = (uint)(byte)((byte)local_660[0] % (byte)op->characteristic_);
  }
  local_670._0_4_ = 1;
  local_648 = op;
  local_638 = (ulong)bVar3;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
            (&local_698,&local_510,0x2a,1,2,local_660,"op.add_and_multiply(z23, z24, T(3))",
             &local_670,"1");
  local_c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_b8 = "";
  local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_c0,0x2d);
  local_690 = 0;
  local_698 = &PTR__lazy_ostream_00118ce8;
  local_688 = &boost::unit_test::lazy_ostream::inst;
  local_680 = "";
  local_520 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_518 = "";
  local_660[0] = Gudhi::persistence_fields::Zp_field_operators<unsigned_int,_void>::add
                           (local_648,z21,2);
  local_670._0_4_ = 1;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
            (&local_698,&local_520,0x2d,1,2,local_660,"op.add(z21, z22)",&local_670,"1");
  uVar2 = local_640;
  local_e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_d8 = "";
  local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_e0,0x2e);
  pZVar1 = local_648;
  local_690 = 0;
  local_698 = &PTR__lazy_ostream_00118ce8;
  local_688 = &boost::unit_test::lazy_ostream::inst;
  local_680 = "";
  local_530 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_528 = "";
  EVar9 = (Element_conflict)local_638;
  EVar8 = (Element_conflict)uVar2;
  local_660[0] = Gudhi::persistence_fields::Zp_field_operators<unsigned_int,_void>::add
                           (local_648,EVar9,EVar8);
  local_670._0_4_ = 1;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
            (&local_698,&local_530,0x2e,1,2,local_660,"op.add(z23, z24)",&local_670,"1");
  local_100 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_f8 = "";
  local_110 = &boost::unit_test::basic_cstring<char_const>::null;
  local_108 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_100,0x2f);
  local_690 = 0;
  local_698 = &PTR__lazy_ostream_00118ce8;
  local_688 = &boost::unit_test::lazy_ostream::inst;
  local_680 = "";
  local_540 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_538 = "";
  local_660[0] = Gudhi::persistence_fields::Zp_field_operators<unsigned_int,_void>::add
                           (pZVar1,EVar9,3);
  local_670._0_4_ = 0;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
            (&local_698,&local_540,0x2f,1,2,local_660,"op.add(z23, T(3))",&local_670,"0");
  local_120 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_118 = "";
  local_130 = &boost::unit_test::basic_cstring<char_const>::null;
  local_128 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_120,0x30);
  local_690 = 0;
  local_698 = &PTR__lazy_ostream_00118ce8;
  local_688 = &boost::unit_test::lazy_ostream::inst;
  local_680 = "";
  local_550 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_548 = "";
  local_660[0] = Gudhi::persistence_fields::Zp_field_operators<unsigned_int,_void>::add
                           (pZVar1,EVar8,3);
  local_670._0_4_ = 1;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
            (&local_698,&local_550,0x30,1,2,local_660,"op.add(z24, T(3))",&local_670,"1");
  local_140 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_138 = "";
  local_150 = &boost::unit_test::basic_cstring<char_const>::null;
  local_148 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_140,0x31);
  local_690 = 0;
  local_698 = &PTR__lazy_ostream_00118ce8;
  local_688 = &boost::unit_test::lazy_ostream::inst;
  local_680 = "";
  local_560 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_558 = "";
  if (pZVar1->characteristic_ < 7) {
    e1 = (Element_conflict)(byte)(6 % (byte)pZVar1->characteristic_);
  }
  else {
    e1 = 6;
  }
  local_660[0] = Gudhi::persistence_fields::Zp_field_operators<unsigned_int,_void>::add
                           (pZVar1,e1,EVar9);
  local_670._0_4_ = 1;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
            (&local_698,&local_560,0x31,1,2,local_660,"op.add(op.get_value(6u), z23)",&local_670,"1"
            );
  local_160 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_158 = "";
  local_170 = &boost::unit_test::basic_cstring<char_const>::null;
  local_168 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_160,0x32);
  local_690 = 0;
  local_698 = &PTR__lazy_ostream_00118ce8;
  local_688 = &boost::unit_test::lazy_ostream::inst;
  local_680 = "";
  local_570 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_568 = "";
  if (pZVar1->characteristic_ < 7) {
    EVar9 = (Element_conflict)(byte)(6 % (byte)pZVar1->characteristic_);
  }
  else {
    EVar9 = 6;
  }
  local_660[0] = Gudhi::persistence_fields::Zp_field_operators<unsigned_int,_void>::add
                           (pZVar1,EVar9,EVar8);
  local_670._0_4_ = 0;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
            (&local_698,&local_570,0x32,1,2,local_660,"op.add(op.get_value(6u), z24)",&local_670,"0"
            );
  z21 = Gudhi::persistence_fields::Zp_field_operators<unsigned_int,_void>::add(pZVar1,z21,3);
  local_180 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_178 = "";
  local_190 = &boost::unit_test::basic_cstring<char_const>::null;
  local_188 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_180,0x34);
  local_690 = 0;
  local_698 = &PTR__lazy_ostream_00118ce8;
  local_688 = &boost::unit_test::lazy_ostream::inst;
  local_680 = "";
  local_1a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_198 = "";
  local_660[0] = 0;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
            (&local_698,&local_1a0,0x34,1,2,&z21,"z21",local_660,"0");
  z21 = Gudhi::persistence_fields::Zp_field_operators<unsigned_int,_void>::add(pZVar1,z21,2);
  local_1b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_1a8 = "";
  local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1b8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1b0,0x36);
  local_690 = 0;
  local_698 = &PTR__lazy_ostream_00118ce8;
  local_688 = &boost::unit_test::lazy_ostream::inst;
  local_680 = "";
  local_1d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_1c8 = "";
  local_660[0] = 0;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
            (&local_698,&local_1d0,0x36,1,2,&z21,"z21",local_660,"0");
  uVar4 = z21;
  if (pZVar1->characteristic_ <= z21) {
    uVar4 = z21 % pZVar1->characteristic_;
  }
  local_1e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_1d8 = "";
  local_1f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1e0,0x3a);
  local_690 = 0;
  local_698 = &PTR__lazy_ostream_00118ce8;
  local_688 = &boost::unit_test::lazy_ostream::inst;
  local_680 = "";
  local_580 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_578 = "";
  local_660[0] = Gudhi::persistence_fields::Zp_field_operators<unsigned_int,_void>::subtract
                           (local_648,z21,2);
  uVar2 = local_640;
  local_670._0_4_ = 0;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
            (&local_698,&local_580,0x3a,1,2,local_660,"op.subtract(z21, z22)",&local_670,"0");
  local_200 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_1f8 = "";
  local_210 = &boost::unit_test::basic_cstring<char_const>::null;
  local_208 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_200,0x3b);
  local_690 = 0;
  local_698 = &PTR__lazy_ostream_00118ce8;
  local_688 = &boost::unit_test::lazy_ostream::inst;
  local_680 = "";
  local_590 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_588 = "";
  EVar8 = (Element_conflict)uVar2;
  local_660[0] = Gudhi::persistence_fields::Zp_field_operators<unsigned_int,_void>::subtract
                           (local_648,uVar4,EVar8);
  local_670._0_4_ = 0;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
            (&local_698,&local_590,0x3b,1,2,local_660,"op.subtract(z23, z24)",&local_670,"0");
  local_220 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_218 = "";
  local_230 = &boost::unit_test::basic_cstring<char_const>::null;
  local_228 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_220,0x3c);
  local_690 = 0;
  local_698 = &PTR__lazy_ostream_00118ce8;
  local_688 = &boost::unit_test::lazy_ostream::inst;
  local_680 = "";
  local_5a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_598 = "";
  local_660[0] = Gudhi::persistence_fields::Zp_field_operators<unsigned_int,_void>::subtract
                           (local_648,uVar4,3);
  local_670._0_4_ = 1;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
            (&local_698,&local_5a0,0x3c,1,2,local_660,"op.subtract(z23, T(3))",&local_670,"1");
  local_240 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_238 = "";
  local_250 = &boost::unit_test::basic_cstring<char_const>::null;
  local_248 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_240,0x3d);
  local_690 = 0;
  local_698 = &PTR__lazy_ostream_00118ce8;
  local_688 = &boost::unit_test::lazy_ostream::inst;
  local_680 = "";
  local_5b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_5a8 = "";
  local_660[0] = Gudhi::persistence_fields::Zp_field_operators<unsigned_int,_void>::subtract
                           (local_648,EVar8,3);
  local_670._0_4_ = 1;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
            (&local_698,&local_5b0,0x3d,1,2,local_660,"op.subtract(z24, T(3))",&local_670,"1");
  local_260 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_258 = "";
  local_270 = &boost::unit_test::basic_cstring<char_const>::null;
  local_268 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_260,0x3e);
  local_690 = 0;
  local_698 = &PTR__lazy_ostream_00118ce8;
  local_688 = &boost::unit_test::lazy_ostream::inst;
  local_680 = "";
  local_5c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_5b8 = "";
  if (local_648->characteristic_ < 7) {
    EVar9 = (Element_conflict)(byte)(6 % (byte)local_648->characteristic_);
  }
  else {
    EVar9 = 6;
  }
  local_660[0] = Gudhi::persistence_fields::Zp_field_operators<unsigned_int,_void>::subtract
                           (local_648,EVar9,uVar4);
  local_670._0_4_ = 0;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
            (&local_698,&local_5c0,0x3e,1,2,local_660,"op.subtract(op.get_value(6u), z23)",
             &local_670,"0");
  local_280 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_278 = "";
  local_290 = &boost::unit_test::basic_cstring<char_const>::null;
  local_288 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_280,0x3f);
  pZVar1 = local_648;
  local_690 = 0;
  local_698 = &PTR__lazy_ostream_00118ce8;
  local_688 = &boost::unit_test::lazy_ostream::inst;
  local_680 = "";
  local_5d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_5c8 = "";
  if (local_648->characteristic_ < 7) {
    EVar9 = (Element_conflict)(byte)(6 % (byte)local_648->characteristic_);
  }
  else {
    EVar9 = 6;
  }
  local_660[0] = Gudhi::persistence_fields::Zp_field_operators<unsigned_int,_void>::subtract
                           (local_648,EVar9,EVar8);
  local_670._0_4_ = 0;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
            (&local_698,&local_5d0,0x3f,1,2,local_660,"op.subtract(op.get_value(6u), z24)",
             &local_670,"0");
  z21 = Gudhi::persistence_fields::Zp_field_operators<unsigned_int,_void>::subtract(pZVar1,z21,3);
  local_2a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_298 = "";
  local_2b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2a0,0x41);
  local_690 = 0;
  local_698 = &PTR__lazy_ostream_00118ce8;
  local_688 = &boost::unit_test::lazy_ostream::inst;
  local_680 = "";
  local_2c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_2b8 = "";
  local_660[0] = 1;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
            (&local_698,&local_2c0,0x41,1,2,&z21,"z21",local_660,"1");
  z21 = Gudhi::persistence_fields::Zp_field_operators<unsigned_int,_void>::subtract(local_648,z21,2)
  ;
  local_2d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_2c8 = "";
  local_2e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2d8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2d0,0x43);
  pZVar1 = local_648;
  local_690 = 0;
  local_698 = &PTR__lazy_ostream_00118ce8;
  local_688 = &boost::unit_test::lazy_ostream::inst;
  local_680 = "";
  local_2f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_2e8 = "";
  local_660[0] = 1;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
            (&local_698,&local_2f0,0x43,1,2,&z21,"z21",local_660,"1");
  uVar4 = z21;
  if (pZVar1->characteristic_ <= z21) {
    uVar4 = z21 % pZVar1->characteristic_;
  }
  local_300 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_2f8 = "";
  local_310 = &boost::unit_test::basic_cstring<char_const>::null;
  local_308 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_300,0x47);
  local_690 = 0;
  local_698 = &PTR__lazy_ostream_00118ce8;
  local_688 = &boost::unit_test::lazy_ostream::inst;
  local_680 = "";
  local_5e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_5d8 = "";
  local_660[0] = Gudhi::persistence_fields::Zp_field_operators<unsigned_int,_void>::multiply
                           (pZVar1,z21,2);
  uVar2 = local_640;
  local_670._0_4_ = 0;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
            (&local_698,&local_5e0,0x47,1,2,local_660,"op.multiply(z21, z22)",&local_670,"0");
  local_320 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_318 = "";
  local_330 = &boost::unit_test::basic_cstring<char_const>::null;
  local_328 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_320,0x48);
  local_690 = 0;
  local_698 = &PTR__lazy_ostream_00118ce8;
  local_688 = &boost::unit_test::lazy_ostream::inst;
  local_680 = "";
  local_5f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_5e8 = "";
  EVar8 = (Element_conflict)uVar2;
  local_660[0] = Gudhi::persistence_fields::Zp_field_operators<unsigned_int,_void>::multiply
                           (pZVar1,uVar4,EVar8);
  local_670._0_4_ = 0;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
            (&local_698,&local_5f0,0x48,1,2,local_660,"op.multiply(z23, z24)",&local_670,"0");
  local_340 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_338 = "";
  local_350 = &boost::unit_test::basic_cstring<char_const>::null;
  local_348 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_340,0x49);
  local_690 = 0;
  local_698 = &PTR__lazy_ostream_00118ce8;
  local_688 = &boost::unit_test::lazy_ostream::inst;
  local_680 = "";
  local_600 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_5f8 = "";
  local_660[0] = Gudhi::persistence_fields::Zp_field_operators<unsigned_int,_void>::multiply
                           (pZVar1,uVar4,3);
  local_670._0_4_ = 1;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
            (&local_698,&local_600,0x49,1,2,local_660,"op.multiply(z23, T(3))",&local_670,"1");
  local_360 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_358 = "";
  local_370 = &boost::unit_test::basic_cstring<char_const>::null;
  local_368 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_360,0x4a);
  local_690 = 0;
  local_698 = &PTR__lazy_ostream_00118ce8;
  local_688 = &boost::unit_test::lazy_ostream::inst;
  local_680 = "";
  local_610 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_608 = "";
  local_660[0] = Gudhi::persistence_fields::Zp_field_operators<unsigned_int,_void>::multiply
                           (pZVar1,EVar8,3);
  local_670._0_4_ = 0;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
            (&local_698,&local_610,0x4a,1,2,local_660,"op.multiply(z24, T(3))",&local_670,"0");
  local_380 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_378 = "";
  local_390 = &boost::unit_test::basic_cstring<char_const>::null;
  local_388 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_380,0x4b);
  local_690 = 0;
  local_698 = &PTR__lazy_ostream_00118ce8;
  local_688 = &boost::unit_test::lazy_ostream::inst;
  local_680 = "";
  local_620 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_618 = "";
  if (pZVar1->characteristic_ < 7) {
    EVar9 = (Element_conflict)(byte)(6 % (byte)pZVar1->characteristic_);
  }
  else {
    EVar9 = 6;
  }
  local_660[0] = Gudhi::persistence_fields::Zp_field_operators<unsigned_int,_void>::multiply
                           (pZVar1,EVar9,uVar4);
  local_670._0_4_ = 0;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
            (&local_698,&local_620,0x4b,1,2,local_660,"op.multiply(op.get_value(6u), z23)",
             &local_670,"0");
  local_3a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_398 = "";
  local_3b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_3a0,0x4c);
  local_690 = 0;
  local_698 = &PTR__lazy_ostream_00118ce8;
  local_688 = &boost::unit_test::lazy_ostream::inst;
  local_680 = "";
  local_630 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_628 = "";
  if (pZVar1->characteristic_ < 7) {
    EVar9 = (Element_conflict)(byte)(6 % (byte)pZVar1->characteristic_);
  }
  else {
    EVar9 = 6;
  }
  local_660[0] = Gudhi::persistence_fields::Zp_field_operators<unsigned_int,_void>::multiply
                           (pZVar1,EVar9,EVar8);
  local_670 = (char *)((ulong)local_670._4_4_ << 0x20);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
            (&local_698,&local_630,0x4c,1,2,local_660,"op.multiply(op.get_value(6u), z24)",
             &local_670,"0");
  z21 = Gudhi::persistence_fields::Zp_field_operators<unsigned_int,_void>::multiply(pZVar1,z21,3);
  local_3c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_3b8 = "";
  local_3d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3c8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_3c0,0x4e);
  local_690 = 0;
  local_698 = &PTR__lazy_ostream_00118ce8;
  local_688 = &boost::unit_test::lazy_ostream::inst;
  local_680 = "";
  local_3e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_3d8 = "";
  local_660[0] = 1;
  uVar4 = 2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
            (&local_698,&local_3e0,0x4e,1,2,&z21,"z21",local_660,"1");
  z21 = Gudhi::persistence_fields::Zp_field_operators<unsigned_int,_void>::multiply(local_648,z21,2)
  ;
  local_3f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_3e8 = "";
  local_400 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3f8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_3f0,0x50);
  pZVar1 = local_648;
  local_690 = 0;
  local_698 = &PTR__lazy_ostream_00118ce8;
  local_688 = &boost::unit_test::lazy_ostream::inst;
  local_680 = "";
  local_410 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_408 = "";
  local_660[0] = 0;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
            (&local_698,&local_410,0x50,1,2,&z21,"z21",local_660,"0");
  uVar5 = z21;
  if (pZVar1->characteristic_ <= z21) {
    uVar5 = z21 % pZVar1->characteristic_;
  }
  local_420 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_418 = "";
  local_430 = &boost::unit_test::basic_cstring<char_const>::null;
  local_428 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_420,0x54);
  uVar6 = z21;
  if (pZVar1->characteristic_ <= z21) {
    uVar6 = z21 % pZVar1->characteristic_;
  }
  local_658 = 0;
  sStack_650.pi_ = (sp_counted_base *)0x0;
  local_670 = "op.are_equal(z21, 0u)";
  local_668 = "";
  local_690 = 0;
  local_698 = &PTR__lazy_ostream_00118d68;
  local_688 = &boost::unit_test::lazy_ostream::inst;
  local_680 = (char *)&local_670;
  local_440 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_438 = "";
  local_660[0]._0_1_ = uVar6 == 0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_650);
  local_450 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_448 = "";
  local_460 = &boost::unit_test::basic_cstring<char_const>::null;
  local_458 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_450,0x55);
  uVar6 = pZVar1->characteristic_;
  uVar7 = z21;
  if (uVar6 <= z21) {
    uVar7 = z21 % uVar6;
  }
  if (uVar6 < 3) {
    uVar4 = (uint)(byte)(2 % (byte)uVar6);
  }
  local_660[0]._0_1_ = uVar7 == uVar4;
  local_658 = 0;
  sStack_650.pi_ = (sp_counted_base *)0x0;
  local_670 = "op.are_equal(z21, z22)";
  local_668 = "";
  local_690 = 0;
  local_698 = &PTR__lazy_ostream_00118d68;
  local_688 = &boost::unit_test::lazy_ostream::inst;
  local_680 = (char *)&local_670;
  local_470 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_468 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_650);
  local_480 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_478 = "";
  local_490 = &boost::unit_test::basic_cstring<char_const>::null;
  local_488 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_480,0x56);
  uVar2 = local_640;
  uVar4 = pZVar1->characteristic_;
  uVar6 = (uint)local_640;
  uVar7 = z21;
  if (uVar4 <= z21) {
    uVar7 = z21 % uVar4;
  }
  if (uVar4 <= uVar5) {
    uVar5 = uVar5 % uVar4;
  }
  local_660[0]._0_1_ = uVar7 == uVar5;
  local_658 = 0;
  sStack_650.pi_ = (sp_counted_base *)0x0;
  local_670 = "op.are_equal(op.get_value(z21), z23)";
  local_668 = "";
  local_690 = 0;
  local_698 = &PTR__lazy_ostream_00118d68;
  local_688 = &boost::unit_test::lazy_ostream::inst;
  local_680 = (char *)&local_670;
  local_4a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_498 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_650);
  local_4b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_4a8 = "";
  local_4c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4b8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_4b0,0x57);
  uVar4 = pZVar1->characteristic_;
  uVar5 = z21;
  if (uVar4 <= z21) {
    uVar5 = z21 % uVar4;
  }
  if (uVar4 <= uVar6) {
    uVar6 = (uint)(byte)(((ushort)uVar2 & 0xff) % (ushort)(byte)uVar4);
  }
  local_660[0] = CONCAT31(local_660[0]._1_3_,uVar5 == uVar6);
  local_658 = 0;
  sStack_650.pi_ = (sp_counted_base *)0x0;
  local_670 = "op.are_equal(op.get_value(z21), z24)";
  local_668 = "";
  local_690 = 0;
  local_698 = &PTR__lazy_ostream_00118d68;
  local_688 = &boost::unit_test::lazy_ostream::inst;
  local_680 = (char *)&local_670;
  local_4d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_4c8 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_650);
  return;
}

Assistant:

void test_z2_standart_field_operators(Z2& op) {
  using T = typename Z2::Element;

  unsigned int z21 = 7u;
  unsigned int z22 = 2u;
  T z23 = op.get_value(7u);
  T z24 = op.get_value(2u);

  // e * m + a
  BOOST_CHECK_EQUAL(op.multiply_and_add(z21, z22, 3u), 1);
  BOOST_CHECK_EQUAL(op.multiply_and_add(z23, z24, T(3)), 1);

  //(e + a) * m
  BOOST_CHECK_EQUAL(op.add_and_multiply(z21, z22, 3u), 1);
  BOOST_CHECK_EQUAL(op.add_and_multiply(z23, z24, T(3)), 1);

  //+
  BOOST_CHECK_EQUAL(op.add(z21, z22), 1);
  BOOST_CHECK_EQUAL(op.add(z23, z24), 1);
  BOOST_CHECK_EQUAL(op.add(z23, T(3)), 0);
  BOOST_CHECK_EQUAL(op.add(z24, T(3)), 1);
  BOOST_CHECK_EQUAL(op.add(op.get_value(6u), z23), 1);
  BOOST_CHECK_EQUAL(op.add(op.get_value(6u), z24), 0);
  z21 = op.add(z21, 3u);
  BOOST_CHECK_EQUAL(z21, 0);
  z21 = op.add(z21, z22);
  BOOST_CHECK_EQUAL(z21, 0);
  z23 = op.get_value(z21);

  //-
  BOOST_CHECK_EQUAL(op.subtract(z21, z22), 0);
  BOOST_CHECK_EQUAL(op.subtract(z23, z24), 0);
  BOOST_CHECK_EQUAL(op.subtract(z23, T(3)), 1);
  BOOST_CHECK_EQUAL(op.subtract(z24, T(3)), 1);
  BOOST_CHECK_EQUAL(op.subtract(op.get_value(6u), z23), 0);
  BOOST_CHECK_EQUAL(op.subtract(op.get_value(6u), z24), 0);
  z21 = op.subtract(z21, 3u);
  BOOST_CHECK_EQUAL(z21, 1);
  z21 = op.subtract(z21, z22);
  BOOST_CHECK_EQUAL(z21, 1);
  z23 = op.get_value(z21);

  //*
  BOOST_CHECK_EQUAL(op.multiply(z21, z22), 0);
  BOOST_CHECK_EQUAL(op.multiply(z23, z24), 0);
  BOOST_CHECK_EQUAL(op.multiply(z23, T(3)), 1);
  BOOST_CHECK_EQUAL(op.multiply(z24, T(3)), 0);
  BOOST_CHECK_EQUAL(op.multiply(op.get_value(6u), z23), 0);
  BOOST_CHECK_EQUAL(op.multiply(op.get_value(6u), z24), 0);
  z21 = op.multiply(z21, 3u);
  BOOST_CHECK_EQUAL(z21, 1);
  z21 = op.multiply(z21, z22);
  BOOST_CHECK_EQUAL(z21, 0);
  z23 = op.get_value(z21);

  //==
  BOOST_CHECK(op.are_equal(z21, 0u));
  BOOST_CHECK(op.are_equal(z21, z22));
  BOOST_CHECK(op.are_equal(op.get_value(z21), z23));
  BOOST_CHECK(op.are_equal(op.get_value(z21), z24));
}